

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap4.c
# Opt level: O3

int Cdnan(double *val)

{
  ushort uVar1;
  
  uVar1 = *(ushort *)((long)val + 6) & 0x7ff0;
  if (uVar1 == 0) {
    *val = 0.0;
  }
  return (int)(uVar1 == 0x7ff0 || uVar1 == 0);
}

Assistant:

int Cdnan( double *val )
{
   int code;

#if BYTESWAPPED
   short *sptr = (short*)val + 3;
#else
   short *sptr = (short*)val;
#endif

   code = dnan(*sptr);
   if( code==2 ) *val = 0.0;   /* Underflow */

   return( code!=0 );
}